

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryWriter::write<pbrt::Camera>(BinaryWriter *this,shared_ptr<pbrt::Camera> *t)

{
  SP *in_RSI;
  BinaryWriter *in_RDI;
  BinaryWriter *this_00;
  int32_t local_14;
  BinaryWriter *this_01;
  
  this_00 = (BinaryWriter *)&stack0xffffffffffffffd8;
  this_01 = in_RDI;
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Camera,void>
            ((shared_ptr<pbrt::Entity> *)this_00,(shared_ptr<pbrt::Camera> *)in_RDI);
  local_14 = serialize(this_01,in_RSI);
  write<int>(this_00,(int *)in_RDI);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x15071c);
  return;
}

Assistant:

void write(std::shared_ptr<T> t)
    {
      write(serialize(t));
    }